

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

ProgramBinary * __thiscall
vk::BinaryRegistryDetail::BinaryRegistryReader::loadProgram
          (BinaryRegistryReader *this,ProgramIdentifier *id)

{
  Archive *pAVar1;
  code *pcVar2;
  PtrData<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
  data;
  bool bVar3;
  int iVar4;
  deBool dVar5;
  LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *pLVar6;
  undefined8 uVar7;
  deUint32 *pdVar8;
  Resource *pRVar9;
  size_type sVar10;
  InternalError *this_00;
  reference pvVar11;
  BinaryRegistryReader *this_01;
  ProgramNotFoundException *this_02;
  LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  ProgramIdentifier *id_00;
  allocator<char> local_1a9;
  string local_1a8 [2];
  ResourceError *e_1;
  undefined1 local_150 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  int progSize;
  UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> progRes;
  string fullPath;
  deUint32 *indexPos;
  ResourceError *e;
  string local_80;
  MovePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> local_60 [2];
  PtrData<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
  local_40;
  PtrData<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
  *local_30;
  ProgramIdentifier *local_20;
  ProgramIdentifier *id_local;
  BinaryRegistryReader *this_local;
  
  local_20 = id;
  id_local = (ProgramIdentifier *)this;
  bVar3 = de::details::UniqueBase::operator_cast_to_bool((UniqueBase *)&this->m_binaryIndex);
  if (!bVar3) {
    pLVar6 = (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *)operator_new(0x50);
    e._6_1_ = 1;
    pAVar1 = this->m_archive;
    anon_unknown_8::getIndexPath(&local_80,&this->m_srcPath);
    uVar7 = std::__cxx11::string::c_str();
    iVar4 = (*pAVar1->_vptr_Archive[2])(pAVar1,uVar7);
    de::DefaultDeleter<tcu::Resource>::DefaultDeleter
              ((DefaultDeleter<tcu::Resource> *)((long)&e + 7));
    de::details::MovePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::MovePtr(local_60,iVar4)
    ;
    LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::LazyResource(pLVar6,local_60);
    e._6_1_ = 0;
    de::
    DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>
    ::DefaultDeleter((DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                      *)((long)&e + 5));
    de::details::
    MovePtr<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
    ::MovePtr((MovePtr<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
               *)&local_40);
    local_30 = de::details::MovePtr::operator_cast_to_PtrData(&local_40,(MovePtr *)pLVar6);
    data._8_8_ = in_stack_fffffffffffffd70;
    data.ptr = in_stack_fffffffffffffd68;
    de::details::
    MovePtr<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
    ::operator=(&this->m_binaryIndex,data);
    de::details::
    MovePtr<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
    ::~MovePtr((MovePtr<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
                *)&local_40);
    de::details::MovePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~MovePtr(local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pLVar6 = de::details::
           UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
           ::get(&(this->m_binaryIndex).
                  super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
                );
  pdVar8 = anon_unknown_8::findBinaryIndex(pLVar6,local_20);
  if (pdVar8 == (deUint32 *)0x0) {
    this_02 = (ProgramNotFoundException *)__cxa_allocate_exception(0x38);
    id_00 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"Program not found in index",&local_1a9);
    ProgramNotFoundException::ProgramNotFoundException(this_02,id_00,local_1a8);
    __cxa_throw(this_02,&ProgramNotFoundException::typeinfo,
                ProgramNotFoundException::~ProgramNotFoundException);
  }
  anon_unknown_8::getProgramPath
            ((string *)
             &progRes.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.
              field_0x8,&this->m_srcPath,*pdVar8);
  pAVar1 = this->m_archive;
  uVar7 = std::__cxx11::string::c_str();
  iVar4 = (*pAVar1->_vptr_Archive[2])(pAVar1,uVar7);
  de::DefaultDeleter<tcu::Resource>::DefaultDeleter
            ((DefaultDeleter<tcu::Resource> *)
             ((long)&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::UniquePtr
            ((UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)&progSize,iVar4);
  pRVar9 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)&progSize);
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = (*pRVar9->_vptr_Resource[3])();
  sVar10 = (size_type)
           (int)(uint)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&e_1 + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150,sVar10,
             (allocator<unsigned_char> *)((long)&e_1 + 7));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&e_1 + 7));
  while( true ) {
    dVar5 = ::deGetFalse();
    if (dVar5 != 0) break;
    bVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150);
    if (bVar3) break;
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      pRVar9 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::
               operator->((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)&progSize
                         );
      pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150,0);
      (*pRVar9->_vptr_Resource[2])
                (pRVar9,pvVar11,
                 (ulong)(uint)bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_01 = (BinaryRegistryReader *)operator_new(0x20);
      sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150);
      pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150,0);
      ProgramBinary::ProgramBinary((ProgramBinary *)this_01,PROGRAM_FORMAT_SPIRV,sVar10,pvVar11);
      e_1._0_4_ = 1;
      this_local = this_01;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_150);
      de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniquePtr
                ((UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)&progSize);
      std::__cxx11::string::~string
                ((string *)
                 &progRes.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data
                  .field_0x8);
      if ((int)e_1 != 0) {
        return (ProgramBinary *)this_local;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,"!bytes.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.cpp"
             ,0x25b);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

ProgramBinary* BinaryRegistryReader::loadProgram (const ProgramIdentifier& id) const
{
	if (!m_binaryIndex)
	{
		try
		{
			m_binaryIndex = BinaryIndexPtr(new BinaryIndexAccess(de::MovePtr<tcu::Resource>(m_archive.getResource(getIndexPath(m_srcPath).c_str()))));
		}
		catch (const tcu::ResourceError& e)
		{
			throw ProgramNotFoundException(id, string("Failed to open binary index (") + e.what() + ")");
		}
	}

	{
		const deUint32*	indexPos	= findBinaryIndex(m_binaryIndex.get(), id);

		if (indexPos)
		{
			const string	fullPath	= getProgramPath(m_srcPath, *indexPos);

			try
			{
				de::UniquePtr<tcu::Resource>	progRes		(m_archive.getResource(fullPath.c_str()));
				const int						progSize	= progRes->getSize();
				vector<deUint8>					bytes		(progSize);

				TCU_CHECK_INTERNAL(!bytes.empty());

				progRes->read(&bytes[0], progSize);

				return new ProgramBinary(vk::PROGRAM_FORMAT_SPIRV, bytes.size(), &bytes[0]);
			}
			catch (const tcu::ResourceError& e)
			{
				throw ProgramNotFoundException(id, e.what());
			}
		}
		else
			throw ProgramNotFoundException(id, "Program not found in index");
	}
}